

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::NeuralNetworkClassifier::SharedDtor(NeuralNetworkClassifier *this)

{
  string *psVar1;
  pointer pcVar2;
  
  psVar1 = (this->labelprobabilitylayername_).ptr_;
  if (psVar1 != (string *)0x0 &&
      psVar1 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    pcVar2 = (psVar1->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &psVar1->field_2) {
      operator_delete(pcVar2,(psVar1->field_2)._M_allocated_capacity + 1);
    }
    operator_delete(psVar1,0x20);
  }
  if ((this != (NeuralNetworkClassifier *)&_NeuralNetworkClassifier_default_instance_) &&
     (this->updateparams_ != (NetworkUpdateParameters *)0x0)) {
    (*(this->updateparams_->super_MessageLite)._vptr_MessageLite[1])();
  }
  if (this->_oneof_case_[0] != 0) {
    clear_ClassLabels(this);
    return;
  }
  return;
}

Assistant:

void NeuralNetworkClassifier::SharedDtor() {
  labelprobabilitylayername_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (this != internal_default_instance()) {
    delete updateparams_;
  }
  if (has_ClassLabels()) {
    clear_ClassLabels();
  }
}